

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::GoniometricLight,pbrt::Transform&,pbrt::MediumHandle&,pbrt::SpectrumHandle&,float&,pbrt::Image,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,GoniometricLight *p,Transform *args,
          MediumHandle *args_1,SpectrumHandle *args_2,float *args_3,Image *args_4,
          polymorphic_allocator<std::byte> *args_5)

{
  Float scale;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_c8;
  MediumInterface local_c0;
  Image local_b0;
  
  local_c0.inside =
       (MediumHandle)
       (args_1->
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
       ).bits;
  local_c8.bits =
       (args_2->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  scale = *args_3;
  local_b0.resolution.super_Tuple2<pbrt::Point2,_int>.y =
       (args_4->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  local_b0.format = args_4->format;
  local_b0.resolution.super_Tuple2<pbrt::Point2,_int>.x =
       (args_4->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  local_b0.channelNames.alloc.memoryResource = (args_4->channelNames).alloc.memoryResource;
  local_b0.channelNames.ptr = (args_4->channelNames).ptr;
  auVar1 = *(undefined1 (*) [32])&(args_4->channelNames).nAlloc;
  (args_4->channelNames).nStored = 0;
  (args_4->channelNames).ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (args_4->channelNames).nAlloc = 0;
  auVar2._0_8_ = args_4->encoding;
  auVar2._8_8_ = (args_4->p8).alloc;
  auVar2._16_8_ = (args_4->p8).ptr;
  auVar2._24_8_ = (args_4->p8).nAlloc;
  local_b0._32_32_ = vperm2i128_avx2(auVar1,auVar2,0x20);
  local_b0.p8.nAlloc = (args_4->p8).nAlloc;
  local_b0.p8.nStored = (args_4->p8).nStored;
  local_b0.p8.ptr = (args_4->p8).ptr;
  (args_4->p8).nStored = 0;
  (args_4->p8).ptr = (uchar *)0x0;
  (args_4->p8).nAlloc = 0;
  local_b0.p16.alloc.memoryResource = (args_4->p16).alloc.memoryResource;
  local_b0.p16.nAlloc = (args_4->p16).nAlloc;
  local_b0.p16.nStored = (args_4->p16).nStored;
  local_b0.p16.ptr = (args_4->p16).ptr;
  (args_4->p16).nStored = 0;
  (args_4->p16).ptr = (Half *)0x0;
  (args_4->p16).nAlloc = 0;
  local_b0.p32.alloc.memoryResource = (args_4->p32).alloc.memoryResource;
  local_b0.p32.nAlloc = (args_4->p32).nAlloc;
  local_b0.p32.nStored = (args_4->p32).nStored;
  local_b0.p32.ptr = (args_4->p32).ptr;
  (args_4->p32).nStored = 0;
  (args_4->p32).ptr = (float *)0x0;
  (args_4->p32).nAlloc = 0;
  local_c0.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = local_c0.inside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  pbrt::GoniometricLight::GoniometricLight
            (p,args,&local_c0,(SpectrumHandle *)&local_c8,scale,&local_b0,args_5->memoryResource);
  vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_b0.p32);
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_b0.p16);
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector(&local_b0.p8);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.channelNames);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }